

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::RegexMatchAll
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmCommand *this_00;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer pbVar7;
  undefined8 string;
  char *pcVar8;
  string output;
  string e_1;
  string input;
  RegularExpression re;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  pointer local_138;
  cmCommand *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  RegularExpression local_100;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  bVar4 = cmsys::RegularExpression::compile(&local_100,pbVar1[2]._M_dataplus._M_p);
  if (bVar4) {
    local_178._8_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_178._0_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 4;
    paVar6 = &local_198.field_2;
    local_198._M_string_length = 0;
    local_198.field_2._M_local_buf[0] = '\0';
    local_198._M_dataplus._M_p = (pointer)paVar6;
    local_138 = pbVar1;
    local_128 = pbVar1 + 2;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)&local_158,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_178,paVar6->_M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar6) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                               local_198.field_2._M_local_buf[0]) + 1);
    }
    local_138 = local_138 + 3;
    local_198._M_string_length = 0;
    local_198.field_2._M_local_buf[0] = '\0';
    pbVar1 = (pointer)(local_178 + 0x10);
    string = local_158._M_allocated_capacity;
    local_198._M_dataplus._M_p = (pointer)paVar6;
    local_130 = &this->super_cmCommand;
    while( true ) {
      bVar4 = cmsys::RegularExpression::find(&local_100,(char *)string,&local_100.regmatch);
      if (!bVar4) break;
      cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
      cmMakefile::StoreMatches((this->super_cmCommand).Makefile,&local_100);
      pcVar3 = local_100.regmatch.searchstring;
      pcVar2 = local_100.regmatch.endp[0];
      pcVar8 = local_100.regmatch.startp[0];
      if (local_100.regmatch.endp[0] == local_100.regmatch.startp[0]) {
        std::operator+(&local_120,"sub-command REGEX, mode MATCHALL regex \"",local_128);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
        this_00 = local_130;
        pbVar7 = (pointer)(plVar5 + 2);
        if ((pointer)*plVar5 == pbVar7) {
          local_178._16_8_ = (pbVar7->_M_dataplus)._M_p;
          local_178._24_8_ = plVar5[3];
          local_178._0_8_ = pbVar1;
        }
        else {
          local_178._16_8_ = (pbVar7->_M_dataplus)._M_p;
          local_178._0_8_ = (pointer)*plVar5;
        }
        local_178._8_8_ = plVar5[1];
        *plVar5 = (long)pbVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        cmCommand::SetError(this_00,(string *)local_178);
        if ((pointer)local_178._0_8_ != pbVar1) {
          operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
        }
        goto LAB_002f482d;
      }
      if (local_198._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_198);
      }
      pcVar8 = (char *)(string + ((long)pcVar8 - (long)pcVar3));
      string = string + ((long)pcVar2 - (long)pcVar3);
      local_178._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,pcVar8,string);
      std::__cxx11::string::_M_append((char *)&local_198,local_178._0_8_);
      this = (cmStringCommand *)local_130;
      if ((pointer)local_178._0_8_ != pbVar1) {
        operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
      }
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,local_138,local_198._M_dataplus._M_p)
    ;
LAB_002f482d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                               local_198.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_allocated_capacity != &local_148) {
      operator_delete((void *)local_158._M_allocated_capacity,local_148._M_allocated_capacity + 1);
    }
    bVar4 = !bVar4;
  }
  else {
    std::operator+(&local_198,"sub-command REGEX, mode MATCHALL failed to compile regex \"",
                   pbVar1 + 2);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar6) {
      local_148._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_148._8_8_ = plVar5[3];
      local_158._M_allocated_capacity = (size_type)&local_148;
    }
    else {
      local_148._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_158._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar5;
    }
    local_158._8_8_ = plVar5[1];
    *plVar5 = (long)paVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                               local_198.field_2._M_local_buf[0]) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_allocated_capacity != &local_148) {
      operator_delete((void *)local_158._M_allocated_capacity,local_148._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  return bVar4;
}

Assistant:

bool cmStringCommand::RegexMatchAll(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCHALL <regular_expression> <output variable> <input>
  // [<input>...])\n";
  std::string const& regex = args[2];
  std::string const& outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode MATCHALL failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  const char* p = input.c_str();
  while (re.find(p)) {
    this->Makefile->ClearMatches();
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if (r - l == 0) {
      std::string e = "sub-command REGEX, mode MATCHALL regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }
    if (!output.empty()) {
      output += ";";
    }
    output += std::string(p + l, r - l);
    p += r;
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}